

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O1

void __thiscall libsgp4::Tle::Initialize(Tle *this)

{
  string *psVar1;
  string *psVar2;
  pointer pcVar3;
  TleException *this_00;
  int iVar4;
  ulong uVar5;
  Tle *this_01;
  Tle *this_02;
  Tle *this_03;
  Tle *this_04;
  Tle *this_05;
  Tle *this_06;
  Tle *this_07;
  Tle *this_08;
  Tle *this_09;
  Tle *this_10;
  Tle *this_11;
  Tle *this_12;
  Tle *this_13;
  Tle *this_14;
  uint year;
  uint sat_number_2;
  uint sat_number_1;
  double day;
  undefined1 local_68 [56];
  
  this_01 = (Tle *)local_68;
  this_02 = (Tle *)local_68;
  this_03 = (Tle *)local_68;
  this_04 = (Tle *)local_68;
  this_05 = (Tle *)local_68;
  this_06 = (Tle *)local_68;
  this_07 = (Tle *)local_68;
  this_08 = (Tle *)local_68;
  this_09 = (Tle *)local_68;
  this_10 = (Tle *)local_68;
  this_11 = (Tle *)local_68;
  this_12 = (Tle *)local_68;
  this_13 = (Tle *)local_68;
  this_14 = (Tle *)local_68;
  if ((this->line_one_)._M_string_length == 0x45) {
    if ((this->line_two_)._M_string_length == 0x45) {
      psVar1 = &this->line_one_;
      if (*(psVar1->_M_dataplus)._M_p == '1') {
        psVar2 = &this->line_two_;
        if (*(psVar2->_M_dataplus)._M_p == '2') {
          std::__cxx11::string::substr((ulong)local_68,(ulong)psVar1);
          ExtractInteger(this_01,(string *)local_68,(uint *)(local_68 + 0x2c));
          pcVar3 = local_68 + 0x10;
          if ((pointer)local_68._0_8_ != pcVar3) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
          }
          std::__cxx11::string::substr((ulong)local_68,(ulong)psVar2);
          ExtractInteger(this_02,(string *)local_68,(uint *)(local_68 + 0x28));
          if ((pointer)local_68._0_8_ != pcVar3) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
          }
          if (local_68._44_4_ == local_68._40_4_) {
            this->norad_number_ = local_68._44_4_;
            if ((this->name_)._M_string_length == 0) {
              std::__cxx11::string::substr((ulong)local_68,(ulong)psVar1);
              std::__cxx11::string::operator=((string *)this,(string *)local_68);
              if ((pointer)local_68._0_8_ != pcVar3) {
                operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
              }
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar1);
            std::__cxx11::string::operator=((string *)&this->int_designator_,(string *)local_68);
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            local_68._36_4_ = 0;
            local_68._48_8_ = 0.0;
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar1);
            ExtractInteger(this_03,(string *)local_68,(uint *)(local_68 + 0x24));
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar1);
            ExtractDouble(this_04,(string *)local_68,4,(double *)(local_68 + 0x30));
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar1);
            ExtractDouble(this_05,(string *)local_68,2,&this->mean_motion_dt2_);
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar1);
            ExtractExponential(this_06,(string *)local_68,&this->mean_motion_ddt6_);
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar1);
            ExtractExponential(this_07,(string *)local_68,&this->bstar_);
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar2);
            ExtractDouble(this_08,(string *)local_68,4,&this->inclination_);
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar2);
            ExtractDouble(this_09,(string *)local_68,4,&this->right_ascending_node_);
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar2);
            ExtractDouble(this_10,(string *)local_68,-1,&this->eccentricity_);
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar2);
            ExtractDouble(this_11,(string *)local_68,4,&this->argument_perigee_);
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar2);
            ExtractDouble(this_12,(string *)local_68,4,&this->mean_anomaly_);
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar2);
            ExtractDouble(this_13,(string *)local_68,3,&this->mean_motion_);
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_68,(ulong)psVar2);
            ExtractInteger(this_14,(string *)local_68,&this->orbit_number_);
            if ((pointer)local_68._0_8_ != pcVar3) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
            iVar4 = local_68._36_4_ + 2000;
            if (0x38 < (uint)local_68._36_4_) {
              iVar4 = local_68._36_4_ + 0x76c;
            }
            uVar5 = (ulong)(iVar4 - 1U);
            (this->epoch_).m_encoded =
                 (long)(((double)(long)(uVar5 / 400 +
                                       (((ulong)(iVar4 - 1U >> 2) + uVar5 * 0x16d) - uVar5 / 100)) +
                         (double)local_68._48_8_ + -1.0) * 86400000000.0);
            return;
          }
          this_00 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(this_00,"Satellite numbers do not match");
        }
        else {
          this_00 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(this_00,"Invalid line beginning for line two");
        }
      }
      else {
        this_00 = (TleException *)__cxa_allocate_exception(0x10);
        TleException::TleException(this_00,"Invalid line beginning for line one");
      }
    }
    else {
      this_00 = (TleException *)__cxa_allocate_exception(0x10);
      TleException::TleException(this_00,"Invalid length for line two");
    }
  }
  else {
    this_00 = (TleException *)__cxa_allocate_exception(0x10);
    TleException::TleException(this_00,"Invalid length for line one");
  }
  __cxa_throw(this_00,&TleException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Tle::IsValidLineLength(const std::string& str)
{
    return str.length() == LineLength() ? true : false;
}